

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool CheckWarmup(HTTPRequest *req)

{
  bool bVar1;
  long in_FS_OFFSET;
  string statusmessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  bVar1 = RPCIsInWarmup(&local_38);
  if (bVar1) {
    std::operator+(&bStack_58,"Service temporarily unavailable: ",&local_38);
    RESTERR(req,HTTP_SERVICE_UNAVAILABLE,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return !bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckWarmup(HTTPRequest* req)
{
    std::string statusmessage;
    if (RPCIsInWarmup(&statusmessage))
         return RESTERR(req, HTTP_SERVICE_UNAVAILABLE, "Service temporarily unavailable: " + statusmessage);
    return true;
}